

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_add_front.c
# Opt level: O0

int linkedlist_add_front(s_linkedlist *linked_list,void *element)

{
  s_linkedlist_node *__s;
  s_linkedlist_node *node;
  void *element_local;
  s_linkedlist *linked_list_local;
  
  __s = (s_linkedlist_node *)malloc(0x18);
  if (__s == (s_linkedlist_node *)0x0) {
    linked_list_local._4_4_ = -1;
  }
  else {
    memset(__s,0,0x18);
    __s->element = element;
    if (linked_list->head == (s_linkedlist_node *)0x0) {
      linked_list->head = __s;
    }
    else {
      __s->next = linked_list->head;
      linked_list->head->previous = __s;
      linked_list->head = __s;
    }
    if (linked_list->tail == (s_linkedlist_node *)0x0) {
      linked_list->tail = __s;
    }
    linked_list->size = linked_list->size + 1;
    linked_list_local._4_4_ = 0;
  }
  return linked_list_local._4_4_;
}

Assistant:

int linkedlist_add_front(s_linkedlist *linked_list, void *element) {
    s_linkedlist_node *node = malloc(sizeof(s_linkedlist_node));
    if (node == NULL) {
        return (LINKEDLIST_RETVAL_FAILURE);
    }

    memset(node, 0, sizeof(s_linkedlist_node));

    node->element = element;

    if (linked_list->head == NULL) {
        linked_list->head = node;
    } else {
        node->next                  = linked_list->head;
        linked_list->head->previous = node;
        linked_list->head           = node;
    }

    if (linked_list->tail == NULL) {
        linked_list->tail = node;
    }

    linked_list->size += 1;

    return (LINKEDLIST_RETVAL_SUCCESS);
}